

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_avx2_256_16.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  ulong uVar1;
  int16_t iVar2;
  ushort uVar3;
  int *piVar4;
  int *piVar5;
  undefined1 auVar6 [32];
  uint a;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  uint uVar16;
  uint uVar17;
  parasail_result_t *ppVar18;
  undefined1 (*ptr) [16];
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  short sVar24;
  short sVar25;
  int iVar26;
  uint uVar27;
  uint uVar29;
  uint uVar30;
  undefined4 uVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  uint uVar40;
  int16_t iVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined2 uVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  short sVar56;
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint local_4f8;
  uint local_4e0;
  uint local_4d8;
  uint local_4d0;
  uint local_4c8;
  uint local_4c0;
  uint local_4b8;
  long local_460;
  long local_458;
  long local_450;
  long local_448;
  long local_440;
  long local_438;
  long local_430;
  long local_428;
  long local_420;
  long local_418;
  long local_410;
  long local_408;
  long local_400;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined2 local_1a0;
  undefined2 uStack_19e;
  undefined2 uStack_19c;
  undefined2 uStack_19a;
  undefined2 uStack_198;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  undefined2 uStack_190;
  undefined2 uStack_18e;
  undefined2 uStack_18c;
  undefined2 uStack_18a;
  undefined2 uStack_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined2 local_140;
  undefined2 uStack_13e;
  undefined2 uStack_13c;
  undefined2 uStack_13a;
  undefined2 uStack_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 uStack_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined1 local_120 [32];
  short local_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short sStack_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short sStack_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  undefined2 local_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  int iVar28;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_avx2_256_16_cold_7();
    return (parasail_result_t *)0x0;
  }
  uVar23 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_table_diag_avx2_256_16_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_table_diag_avx2_256_16_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_table_diag_avx2_256_16_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_table_diag_avx2_256_16_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_table_diag_avx2_256_16_cold_2();
      return (parasail_result_t *)0x0;
    }
    uVar36 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      parasail_sg_flags_table_diag_avx2_256_16_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    uVar36 = (ulong)(uint)matrix->length;
  }
  a = (uint)uVar36;
  iVar15 = a + 0xf;
  uVar37 = s2Len + 0xf;
  iVar26 = -open;
  iVar35 = matrix->min;
  iVar28 = -iVar35;
  if (iVar35 != iVar26 && SBORROW4(iVar35,iVar26) == iVar35 + open < 0) {
    iVar28 = open;
  }
  uVar27 = iVar28 - 0x7fff;
  sVar24 = 0x7ffe - (short)matrix->max;
  iVar41 = (int16_t)uVar27;
  local_2e0 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  local_200 = local_2e0;
  if (s1_beg == 0) {
    local_200._0_2_ = (undefined2)(gap << 4);
    local_200._2_2_ = local_200._0_2_;
    local_200._4_2_ = local_200._0_2_;
    local_200._6_2_ = local_200._0_2_;
    local_200._8_2_ = local_200._0_2_;
    local_200._10_2_ = local_200._0_2_;
    local_200._12_2_ = local_200._0_2_;
    local_200._14_2_ = local_200._0_2_;
    local_200._16_2_ = local_200._0_2_;
    local_200._18_2_ = local_200._0_2_;
    local_200._20_2_ = local_200._0_2_;
    local_200._22_2_ = local_200._0_2_;
    local_200._24_2_ = local_200._0_2_;
    local_200._26_2_ = local_200._0_2_;
    local_200._28_2_ = local_200._0_2_;
    local_200._30_2_ = local_200._0_2_;
  }
  local_220._0_8_ = CONCAT26(iVar41,CONCAT24(iVar41,CONCAT22(iVar41,iVar41)));
  local_220._8_8_ = CONCAT26(iVar41,CONCAT24(iVar41,CONCAT22(iVar41,iVar41)));
  local_220._16_8_ = CONCAT26(iVar41,CONCAT24(iVar41,CONCAT22(iVar41,iVar41)));
  local_220._24_8_ = CONCAT26(iVar41,CONCAT24(iVar41,CONCAT22(iVar41,iVar41)));
  local_240._8_8_ = local_220._8_8_;
  local_240._0_8_ = local_220._0_8_;
  local_240._16_8_ = local_220._16_8_;
  local_240._24_8_ = local_220._24_8_;
  local_1c0._8_8_ = local_220._8_8_;
  local_1c0._0_8_ = local_220._0_8_;
  local_1c0._16_8_ = local_220._16_8_;
  local_1c0._24_8_ = local_220._24_8_;
  local_260._8_8_ = local_220._8_8_;
  local_260._0_8_ = local_220._0_8_;
  local_260._16_8_ = local_220._16_8_;
  local_260._24_8_ = local_220._24_8_;
  local_1e0._8_8_ = local_220._8_8_;
  local_1e0._0_8_ = local_220._0_8_;
  local_1e0._16_8_ = local_220._16_8_;
  local_1e0._24_8_ = local_220._24_8_;
  auVar55._0_2_ = (short)iVar26;
  if (s1_beg == 0) {
    auVar42._4_4_ = gap;
    auVar42._0_4_ = gap;
    auVar42._8_4_ = gap;
    auVar42._12_4_ = gap;
    auVar42._16_4_ = gap;
    auVar42._20_4_ = gap;
    auVar42._24_4_ = gap;
    auVar42._28_4_ = gap;
    auVar42 = vpmulld_avx2(auVar42,_DAT_00909260);
    iVar35 = gap * 0xfff7;
    auVar45._4_4_ = iVar35;
    auVar45._0_4_ = iVar35;
    auVar45._8_4_ = iVar35;
    auVar45._12_4_ = iVar35;
    auVar45._16_4_ = iVar35;
    auVar45._20_4_ = iVar35;
    auVar45._24_4_ = iVar35;
    auVar45._28_4_ = iVar35;
    auVar42 = vpblendd_avx2(auVar42,auVar45,0x40);
    auVar46._4_4_ = iVar26;
    auVar46._0_4_ = iVar26;
    auVar46._8_4_ = iVar26;
    auVar46._12_4_ = iVar26;
    auVar46._16_4_ = iVar26;
    auVar46._20_4_ = iVar26;
    auVar46._24_4_ = iVar26;
    auVar46._28_4_ = iVar26;
    auVar45 = vpblendd_avx2(auVar42,auVar46,0x80);
    auVar65 = vpinsrd_avx(ZEXT416((uint)open),gap * 8,1);
    auVar42 = vpmovsxbd_avx2(ZEXT816(0x100000000000000));
    auVar42 = vpermd_avx2(auVar42,ZEXT1632(auVar65));
    auVar42 = vpsubd_avx2(auVar45,auVar42);
    auVar42 = vpshufb_avx2(auVar42,_DAT_009091e0);
    auVar45 = vpermq_avx2(auVar42,0xe8);
    auVar47._0_2_ = (undefined2)(gap * 0xfff9 - open);
    auVar47._2_2_ = auVar47._0_2_;
    auVar47._4_2_ = auVar47._0_2_;
    auVar47._6_2_ = auVar47._0_2_;
    auVar47._8_2_ = auVar47._0_2_;
    auVar47._10_2_ = auVar47._0_2_;
    auVar47._12_2_ = auVar47._0_2_;
    auVar47._14_2_ = auVar47._0_2_;
    auVar47._16_2_ = auVar47._0_2_;
    auVar47._18_2_ = auVar47._0_2_;
    auVar47._20_2_ = auVar47._0_2_;
    auVar47._22_2_ = auVar47._0_2_;
    auVar47._24_2_ = auVar47._0_2_;
    auVar47._26_2_ = auVar47._0_2_;
    auVar47._28_2_ = auVar47._0_2_;
    auVar47._30_2_ = auVar47._0_2_;
    auVar50._0_2_ = (undefined2)(gap * 0xfffa - open);
    auVar50._2_2_ = auVar50._0_2_;
    auVar50._4_2_ = auVar50._0_2_;
    auVar50._6_2_ = auVar50._0_2_;
    auVar50._8_2_ = auVar50._0_2_;
    auVar50._10_2_ = auVar50._0_2_;
    auVar50._12_2_ = auVar50._0_2_;
    auVar50._14_2_ = auVar50._0_2_;
    auVar50._16_2_ = auVar50._0_2_;
    auVar50._18_2_ = auVar50._0_2_;
    auVar50._20_2_ = auVar50._0_2_;
    auVar50._22_2_ = auVar50._0_2_;
    auVar50._24_2_ = auVar50._0_2_;
    auVar50._26_2_ = auVar50._0_2_;
    auVar50._28_2_ = auVar50._0_2_;
    auVar50._30_2_ = auVar50._0_2_;
    auVar42 = vpblendw_avx2(auVar47,auVar50,2);
    auVar51._0_2_ = (undefined2)(gap * 0xfffb - open);
    auVar51._2_2_ = auVar51._0_2_;
    auVar51._4_2_ = auVar51._0_2_;
    auVar51._6_2_ = auVar51._0_2_;
    auVar51._8_2_ = auVar51._0_2_;
    auVar51._10_2_ = auVar51._0_2_;
    auVar51._12_2_ = auVar51._0_2_;
    auVar51._14_2_ = auVar51._0_2_;
    auVar51._16_2_ = auVar51._0_2_;
    auVar51._18_2_ = auVar51._0_2_;
    auVar51._20_2_ = auVar51._0_2_;
    auVar51._22_2_ = auVar51._0_2_;
    auVar51._24_2_ = auVar51._0_2_;
    auVar51._26_2_ = auVar51._0_2_;
    auVar51._28_2_ = auVar51._0_2_;
    auVar51._30_2_ = auVar51._0_2_;
    auVar42 = vpblendw_avx2(auVar42,auVar51,4);
    auVar52._0_2_ = (undefined2)(iVar26 + gap * -4);
    auVar52._2_2_ = auVar52._0_2_;
    auVar52._4_2_ = auVar52._0_2_;
    auVar52._6_2_ = auVar52._0_2_;
    auVar52._8_2_ = auVar52._0_2_;
    auVar52._10_2_ = auVar52._0_2_;
    auVar52._12_2_ = auVar52._0_2_;
    auVar52._14_2_ = auVar52._0_2_;
    auVar52._16_2_ = auVar52._0_2_;
    auVar52._18_2_ = auVar52._0_2_;
    auVar52._20_2_ = auVar52._0_2_;
    auVar52._22_2_ = auVar52._0_2_;
    auVar52._24_2_ = auVar52._0_2_;
    auVar52._26_2_ = auVar52._0_2_;
    auVar52._28_2_ = auVar52._0_2_;
    auVar52._30_2_ = auVar52._0_2_;
    auVar42 = vpblendw_avx2(auVar42,auVar52,8);
    auVar53._0_2_ = (undefined2)(gap * 0xfffd - open);
    auVar53._2_2_ = auVar53._0_2_;
    auVar53._4_2_ = auVar53._0_2_;
    auVar53._6_2_ = auVar53._0_2_;
    auVar53._8_2_ = auVar53._0_2_;
    auVar53._10_2_ = auVar53._0_2_;
    auVar53._12_2_ = auVar53._0_2_;
    auVar53._14_2_ = auVar53._0_2_;
    auVar53._16_2_ = auVar53._0_2_;
    auVar53._18_2_ = auVar53._0_2_;
    auVar53._20_2_ = auVar53._0_2_;
    auVar53._22_2_ = auVar53._0_2_;
    auVar53._24_2_ = auVar53._0_2_;
    auVar53._26_2_ = auVar53._0_2_;
    auVar53._28_2_ = auVar53._0_2_;
    auVar53._30_2_ = auVar53._0_2_;
    auVar42 = vpblendw_avx2(auVar42,auVar53,0x10);
    auVar59._0_2_ = (undefined2)(iVar26 + gap * -2);
    auVar59._2_2_ = auVar59._0_2_;
    auVar59._4_2_ = auVar59._0_2_;
    auVar59._6_2_ = auVar59._0_2_;
    auVar59._8_2_ = auVar59._0_2_;
    auVar59._10_2_ = auVar59._0_2_;
    auVar59._12_2_ = auVar59._0_2_;
    auVar59._14_2_ = auVar59._0_2_;
    auVar59._16_2_ = auVar59._0_2_;
    auVar59._18_2_ = auVar59._0_2_;
    auVar59._20_2_ = auVar59._0_2_;
    auVar59._22_2_ = auVar59._0_2_;
    auVar59._24_2_ = auVar59._0_2_;
    auVar59._26_2_ = auVar59._0_2_;
    auVar59._28_2_ = auVar59._0_2_;
    auVar59._30_2_ = auVar59._0_2_;
    auVar42 = vpblendw_avx2(auVar42,auVar59,0x20);
    auVar54._0_2_ = (undefined2)(iVar26 - gap);
    auVar54._2_2_ = auVar54._0_2_;
    auVar54._4_2_ = auVar54._0_2_;
    auVar54._6_2_ = auVar54._0_2_;
    auVar54._8_2_ = auVar54._0_2_;
    auVar54._10_2_ = auVar54._0_2_;
    auVar54._12_2_ = auVar54._0_2_;
    auVar54._14_2_ = auVar54._0_2_;
    auVar54._16_2_ = auVar54._0_2_;
    auVar54._18_2_ = auVar54._0_2_;
    auVar54._20_2_ = auVar54._0_2_;
    auVar54._22_2_ = auVar54._0_2_;
    auVar54._24_2_ = auVar54._0_2_;
    auVar54._26_2_ = auVar54._0_2_;
    auVar54._28_2_ = auVar54._0_2_;
    auVar54._30_2_ = auVar54._0_2_;
    auVar42 = vpblendw_avx2(auVar42,auVar54,0x40);
    auVar55._2_2_ = auVar55._0_2_;
    auVar55._4_2_ = auVar55._0_2_;
    auVar55._6_2_ = auVar55._0_2_;
    auVar55._8_2_ = auVar55._0_2_;
    auVar55._10_2_ = auVar55._0_2_;
    auVar55._12_2_ = auVar55._0_2_;
    auVar55._14_2_ = auVar55._0_2_;
    auVar55._16_2_ = auVar55._0_2_;
    auVar55._18_2_ = auVar55._0_2_;
    auVar55._20_2_ = auVar55._0_2_;
    auVar55._22_2_ = auVar55._0_2_;
    auVar55._24_2_ = auVar55._0_2_;
    auVar55._26_2_ = auVar55._0_2_;
    auVar55._28_2_ = auVar55._0_2_;
    auVar55._30_2_ = auVar55._0_2_;
    auVar42 = vpblendw_avx2(auVar42,auVar55,0x80);
    local_2e0 = vpblendd_avx2(auVar45,auVar42,0xf0);
  }
  ppVar18 = parasail_result_new_table1(a,s2Len);
  if (ppVar18 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar18->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar18->flag | 0x10221002;
  uVar21 = (ulong)(s2Len + 0x1e);
  ptr = (undefined1 (*) [16])parasail_memalign_int16_t(0x20,uVar21);
  ptr_00 = parasail_memalign_int16_t(0x20,uVar21);
  ptr_01 = parasail_memalign_int16_t(0x20,uVar21);
  if (ptr_01 == (int16_t *)0x0 || (ptr_00 == (int16_t *)0x0 || ptr == (undefined1 (*) [16])0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int16_t(0x20,(long)iVar15);
    if (ptr_02 == (int16_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < (int)a) {
      piVar4 = matrix->mapper;
      uVar21 = 0;
      do {
        ptr_02[uVar21] = (int16_t)piVar4[(byte)_s1[uVar21]];
        uVar21 = uVar21 + 1;
      } while (uVar36 != uVar21);
    }
    iVar35 = a + 1;
    if ((int)(a + 1) < iVar15) {
      iVar35 = iVar15;
    }
    memset(ptr_02 + (int)a,0,(ulong)(~a + iVar35) * 2 + 2);
  }
  else {
    ptr_02 = (int16_t *)0x0;
  }
  uVar44 = (undefined2)uVar36;
  local_a0._2_2_ = uVar44;
  local_a0._0_2_ = uVar44;
  local_a0._4_2_ = uVar44;
  local_a0._6_2_ = uVar44;
  local_a0._8_2_ = uVar44;
  local_a0._10_2_ = uVar44;
  local_a0._12_2_ = uVar44;
  local_a0._14_2_ = uVar44;
  local_a0._16_2_ = uVar44;
  local_a0._18_2_ = uVar44;
  local_a0._20_2_ = uVar44;
  local_a0._22_2_ = uVar44;
  local_a0._24_2_ = uVar44;
  local_a0._26_2_ = uVar44;
  local_a0._28_2_ = uVar44;
  local_a0._30_2_ = uVar44;
  auVar42 = vpcmpeqd_avx2(ZEXT432(a),ZEXT432(a));
  local_c0._0_2_ = (undefined2)s2Len;
  local_c0._2_2_ = local_c0._0_2_;
  local_c0._4_2_ = local_c0._0_2_;
  local_c0._6_2_ = local_c0._0_2_;
  local_c0._8_2_ = local_c0._0_2_;
  local_c0._10_2_ = local_c0._0_2_;
  local_c0._12_2_ = local_c0._0_2_;
  local_c0._14_2_ = local_c0._0_2_;
  local_c0._16_2_ = local_c0._0_2_;
  local_c0._18_2_ = local_c0._0_2_;
  local_c0._20_2_ = local_c0._0_2_;
  local_c0._22_2_ = local_c0._0_2_;
  local_c0._24_2_ = local_c0._0_2_;
  local_c0._26_2_ = local_c0._0_2_;
  local_c0._28_2_ = local_c0._0_2_;
  local_c0._30_2_ = local_c0._0_2_;
  local_e0 = (undefined2)open;
  sVar56 = (short)gap;
  local_160 = vpaddsw_avx2(local_a0,auVar42);
  local_120 = vpaddsw_avx2(local_c0,auVar42);
  piVar4 = matrix->mapper;
  uVar21 = 0;
  do {
    *(short *)(ptr[1] + uVar21 * 2 + 0xe) = (short)piVar4[(byte)_s2[uVar21]];
    uVar21 = uVar21 + 1;
  } while (uVar23 != uVar21);
  *(undefined1 (*) [16])(*ptr + 0xe) = (undefined1  [16])0x0;
  *ptr = (undefined1  [16])0x0;
  uVar20 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar37) {
    uVar20 = uVar37;
  }
  local_100 = sVar56;
  sStack_fe = sVar56;
  sStack_fc = sVar56;
  sStack_fa = sVar56;
  sStack_f8 = sVar56;
  sStack_f6 = sVar56;
  sStack_f4 = sVar56;
  sStack_f2 = sVar56;
  sStack_f0 = sVar56;
  sStack_ee = sVar56;
  sStack_ec = sVar56;
  sStack_ea = sVar56;
  sStack_e8 = sVar56;
  sStack_e6 = sVar56;
  sStack_e4 = sVar56;
  sStack_e2 = sVar56;
  uStack_de = local_e0;
  uStack_dc = local_e0;
  uStack_da = local_e0;
  uStack_d8 = local_e0;
  uStack_d6 = local_e0;
  uStack_d4 = local_e0;
  uStack_d2 = local_e0;
  uStack_d0 = local_e0;
  uStack_ce = local_e0;
  uStack_cc = local_e0;
  uStack_ca = local_e0;
  uStack_c8 = local_e0;
  uStack_c6 = local_e0;
  uStack_c4 = local_e0;
  uStack_c2 = local_e0;
  memset(ptr[1] + uVar23 * 2 + 0xe,0,(ulong)(~s2Len + uVar20) * 2 + 2);
  if (s2_beg == 0) {
    uVar21 = 0;
    do {
      ptr_00[uVar21 + 0xf] = (int16_t)iVar26;
      iVar26 = iVar26 - gap;
      ptr_01[uVar21 + 0xf] = iVar41;
      uVar21 = uVar21 + 1;
    } while (uVar23 != uVar21);
  }
  else {
    uVar21 = 0;
    do {
      ptr_00[uVar21 + 0xf] = 0;
      ptr_01[uVar21 + 0xf] = iVar41;
      uVar21 = uVar21 + 1;
    } while (uVar23 != uVar21);
  }
  lVar19 = 0;
  do {
    ptr_00[lVar19] = iVar41;
    ptr_01[lVar19] = iVar41;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0xf);
  lVar19 = uVar23 + 0xf;
  uVar21 = uVar23;
  do {
    ptr_00[lVar19] = iVar41;
    ptr_01[lVar19] = iVar41;
    lVar19 = lVar19 + 1;
    uVar20 = (int)uVar21 + 1;
    uVar21 = (ulong)uVar20;
  } while ((int)uVar20 < (int)uVar37);
  ptr_00[0xe] = 0;
  if ((int)a < 1) {
    local_280._2_2_ = iVar41;
    local_280._0_2_ = iVar41;
    local_280._4_2_ = iVar41;
    local_280._6_2_ = iVar41;
    local_280._8_2_ = iVar41;
    local_280._10_2_ = iVar41;
    local_280._12_2_ = iVar41;
    local_280._14_2_ = iVar41;
    local_280._16_2_ = iVar41;
    local_280._18_2_ = iVar41;
    local_280._20_2_ = iVar41;
    local_280._22_2_ = iVar41;
    local_280._24_2_ = iVar41;
    local_280._26_2_ = iVar41;
    local_280._28_2_ = iVar41;
    local_280._30_2_ = iVar41;
    local_2a0._2_2_ = sVar24;
    local_2a0._0_2_ = sVar24;
    local_2a0._4_2_ = sVar24;
    local_2a0._6_2_ = sVar24;
    local_2a0._8_2_ = sVar24;
    local_2a0._10_2_ = sVar24;
    local_2a0._12_2_ = sVar24;
    local_2a0._14_2_ = sVar24;
    local_2a0._16_2_ = sVar24;
    local_2a0._18_2_ = sVar24;
    local_2a0._20_2_ = sVar24;
    local_2a0._22_2_ = sVar24;
    local_2a0._24_2_ = sVar24;
    local_2a0._26_2_ = sVar24;
    local_2a0._28_2_ = sVar24;
    local_2a0._30_2_ = sVar24;
    local_1c0 = local_280;
    local_260 = local_280;
    local_1e0 = local_280;
  }
  else {
    local_280._2_2_ = iVar41;
    local_280._0_2_ = iVar41;
    local_280._4_2_ = iVar41;
    local_280._6_2_ = iVar41;
    local_280._8_2_ = iVar41;
    local_280._10_2_ = iVar41;
    local_280._12_2_ = iVar41;
    local_280._14_2_ = iVar41;
    local_280._16_2_ = iVar41;
    local_280._18_2_ = iVar41;
    local_280._20_2_ = iVar41;
    local_280._22_2_ = iVar41;
    local_280._24_2_ = iVar41;
    local_280._26_2_ = iVar41;
    local_280._28_2_ = iVar41;
    local_280._30_2_ = iVar41;
    auVar62 = ZEXT3264(local_280);
    local_180 = vpalignr_avx2(ZEXT1632(local_280._16_16_),local_280,2);
    uVar21 = 1;
    if (1 < (int)uVar37) {
      uVar21 = (ulong)uVar37;
    }
    auVar58 = ZEXT3264(local_220);
    auVar57 = ZEXT3264(local_240);
    local_3e8 = uVar23 * 0x3c + -0x3c;
    lVar19 = uVar23 * 0x40;
    local_400 = uVar23 * 0x38 + -0x38;
    local_408 = uVar23 * 0x34 + -0x34;
    local_410 = uVar23 * 0x18 + -0x18;
    local_418 = uVar23 * 0xc + -0xc;
    local_420 = uVar23 * 0x30 + -0x30;
    local_428 = uVar23 * 0x2c + -0x2c;
    local_430 = uVar23 * 0x24 + -0x24;
    local_438 = uVar23 * 0x20 + -0x20;
    local_440 = uVar23 * 0x1c + -0x1c;
    local_448 = uVar23 * 0x28 + -0x28;
    local_450 = uVar23 * 0x14 + -0x14;
    local_458 = uVar23 * 0x10 + -0x10;
    local_300._8_8_ = 0x80009000a000b;
    local_300._0_8_ = 0xc000d000e000f;
    local_300._16_8_ = 0x4000500060007;
    local_300._24_8_ = 0x100020003;
    local_140 = 1;
    uStack_13e = 1;
    uStack_13c = 1;
    uStack_13a = 1;
    uStack_138 = 1;
    uStack_136 = 1;
    uStack_134 = 1;
    uStack_132 = 1;
    uStack_130 = 1;
    uStack_12e = 1;
    uStack_12c = 1;
    uStack_12a = 1;
    uStack_128 = 1;
    uStack_126 = 1;
    uStack_124 = 1;
    uStack_122 = 1;
    local_1a0 = 0x10;
    uStack_19e = 0x10;
    uStack_19c = 0x10;
    uStack_19a = 0x10;
    uStack_198 = 0x10;
    uStack_196 = 0x10;
    uStack_194 = 0x10;
    uStack_192 = 0x10;
    uStack_190 = 0x10;
    uStack_18e = 0x10;
    uStack_18c = 0x10;
    uStack_18a = 0x10;
    uStack_188 = 0x10;
    uStack_186 = 0x10;
    uStack_184 = 0x10;
    uStack_182 = 0x10;
    local_2a0._2_2_ = sVar24;
    local_2a0._0_2_ = sVar24;
    local_2a0._4_2_ = sVar24;
    local_2a0._6_2_ = sVar24;
    local_2a0._10_2_ = sVar24;
    local_2a0._8_2_ = sVar24;
    local_2a0._12_2_ = sVar24;
    local_2a0._14_2_ = sVar24;
    local_2a0._18_2_ = sVar24;
    local_2a0._16_2_ = sVar24;
    local_2a0._20_2_ = sVar24;
    local_2a0._22_2_ = sVar24;
    local_2a0._26_2_ = sVar24;
    local_2a0._24_2_ = sVar24;
    local_2a0._28_2_ = sVar24;
    local_2a0._30_2_ = sVar24;
    auVar64 = ZEXT3264(local_280);
    auVar63 = ZEXT3264(local_280);
    piVar4 = matrix->matrix;
    uVar37 = a - 1;
    local_3f0 = uVar23 * 4 + -4;
    local_460 = uVar23 * 8 + -8;
    local_3f8 = 0;
    uVar39 = 0;
    do {
      uVar20 = (uint)uVar39;
      if (matrix->type == 0) {
        uVar20 = (uint)ptr_02[uVar39];
        uVar33 = (uint)ptr_02[uVar39 + 1];
        local_4c8 = (uint)ptr_02[uVar39 + 2];
        local_4b8 = (uint)ptr_02[uVar39 + 3];
        uVar40 = (uint)ptr_02[uVar39 + 4];
        uVar30 = (uint)ptr_02[uVar39 + 5];
        local_4f8 = (uint)ptr_02[uVar39 + 6];
        local_4c0 = (uint)ptr_02[uVar39 + 7];
        uVar16 = (uint)ptr_02[uVar39 + 8];
        uVar17 = (uint)ptr_02[uVar39 + 9];
        local_4d0 = (uint)ptr_02[uVar39 + 10];
        uVar22 = (uint)ptr_02[uVar39 + 0xb];
        local_4d8 = (uint)ptr_02[uVar39 + 0xc];
        uVar29 = (uint)ptr_02[uVar39 + 0xd];
        local_4e0 = (uint)ptr_02[uVar39 + 0xe];
        uVar38 = (int)ptr_02[uVar39 + 0xf];
      }
      else {
        uVar33 = uVar20 | 1;
        if (uVar36 <= (uVar39 | 1)) {
          uVar33 = uVar37;
        }
        local_4c8 = uVar20 | 2;
        if (uVar36 <= (uVar39 | 2)) {
          local_4c8 = uVar37;
        }
        local_4b8 = uVar20 | 3;
        if (uVar36 <= (uVar39 | 3)) {
          local_4b8 = uVar37;
        }
        uVar40 = uVar20 | 4;
        if (uVar36 <= (uVar39 | 4)) {
          uVar40 = uVar37;
        }
        uVar30 = uVar20 | 5;
        if (uVar36 <= (uVar39 | 5)) {
          uVar30 = uVar37;
        }
        local_4f8 = uVar20 | 6;
        if (uVar36 <= (uVar39 | 6)) {
          local_4f8 = uVar37;
        }
        local_4c0 = uVar20 | 7;
        if (uVar36 <= (uVar39 | 7)) {
          local_4c0 = uVar37;
        }
        uVar16 = uVar20 | 8;
        if (uVar36 <= (uVar39 | 8)) {
          uVar16 = uVar37;
        }
        uVar17 = uVar20 | 9;
        if (uVar36 <= (uVar39 | 9)) {
          uVar17 = uVar37;
        }
        local_4d0 = uVar20 | 10;
        if (uVar36 <= (uVar39 | 10)) {
          local_4d0 = uVar37;
        }
        uVar22 = uVar20 | 0xb;
        if (uVar36 <= (uVar39 | 0xb)) {
          uVar22 = uVar37;
        }
        local_4d8 = uVar20 | 0xc;
        if (uVar36 <= (uVar39 | 0xc)) {
          local_4d8 = uVar37;
        }
        uVar29 = uVar20 | 0xd;
        if (uVar36 <= (uVar39 | 0xd)) {
          uVar29 = uVar37;
        }
        local_4e0 = uVar20 | 0xe;
        if (uVar36 <= (uVar39 | 0xe)) {
          local_4e0 = uVar37;
        }
        uVar38 = uVar20 | 0xf;
        if (uVar36 <= (uVar39 | 0xf)) {
          uVar38 = uVar37;
        }
      }
      iVar35 = matrix->size;
      uVar1 = uVar39 + 0x10;
      iVar2 = ptr_00[0xe];
      auVar43._2_2_ = iVar2;
      auVar43._0_2_ = iVar2;
      auVar43._4_2_ = iVar2;
      auVar43._6_2_ = iVar2;
      auVar43._8_2_ = iVar2;
      auVar43._10_2_ = iVar2;
      auVar43._12_2_ = iVar2;
      auVar43._14_2_ = iVar2;
      auVar43._16_2_ = iVar2;
      auVar43._18_2_ = iVar2;
      auVar43._20_2_ = iVar2;
      auVar43._22_2_ = iVar2;
      auVar43._24_2_ = iVar2;
      auVar43._26_2_ = iVar2;
      auVar43._28_2_ = iVar2;
      auVar43._30_2_ = iVar2;
      sVar25 = auVar55._0_2_ - (short)uVar39 * sVar56;
      if (s1_beg != 0) {
        sVar25 = 0;
      }
      ptr_00[0xe] = auVar55._0_2_ - (short)uVar1 * sVar56;
      auVar48._2_2_ = sVar25;
      auVar48._0_2_ = sVar25;
      auVar48._4_2_ = sVar25;
      auVar48._6_2_ = sVar25;
      auVar48._8_2_ = sVar25;
      auVar48._10_2_ = sVar25;
      auVar48._12_2_ = sVar25;
      auVar48._14_2_ = sVar25;
      auVar48._16_2_ = sVar25;
      auVar48._18_2_ = sVar25;
      auVar48._20_2_ = sVar25;
      auVar48._22_2_ = sVar25;
      auVar48._24_2_ = sVar25;
      auVar48._26_2_ = sVar25;
      auVar48._28_2_ = sVar25;
      auVar48._30_2_ = sVar25;
      auVar42 = vpblendw_avx2(local_180,auVar48,0x80);
      auVar45 = vpblendd_avx2(local_180,auVar42,0xf0);
      auVar42 = vpblendw_avx2(local_180,auVar43,0x80);
      auVar47 = vpblendd_avx2(local_180,auVar42,0xf0);
      local_80 = vpcmpeqw_avx2(local_300,local_160);
      auVar6._2_2_ = iVar41;
      auVar6._0_2_ = iVar41;
      auVar6._4_2_ = iVar41;
      auVar6._6_2_ = iVar41;
      auVar6._8_2_ = iVar41;
      auVar6._10_2_ = iVar41;
      auVar6._12_2_ = iVar41;
      auVar6._14_2_ = iVar41;
      auVar6._16_2_ = iVar41;
      auVar6._18_2_ = iVar41;
      auVar6._20_2_ = iVar41;
      auVar6._22_2_ = iVar41;
      auVar6._24_2_ = iVar41;
      auVar6._26_2_ = iVar41;
      auVar6._28_2_ = iVar41;
      auVar6._30_2_ = iVar41;
      auVar42 = vpmovsxbw_avx2(_DAT_0090923c);
      uVar34 = 0;
      auVar46 = auVar6;
      do {
        auVar65 = vpinsrw_avx(ZEXT416((uint)piVar4[(long)(int)(local_4c0 * iVar35) +
                                                   (long)*(short *)(ptr[1] + uVar34 * 2)]),
                              (uint)*(ushort *)
                                     (piVar4 + (long)(int)(local_4f8 * iVar35) +
                                               (long)*(short *)(ptr[1] + uVar34 * 2 + 2)),1);
        auVar65 = vpinsrw_avx(auVar65,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar30 * iVar35) +
                                                       (long)*(short *)(ptr[1] + uVar34 * 2 + 4)),2)
        ;
        auVar65 = vpinsrw_avx(auVar65,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar40 * iVar35) +
                                                       (long)*(short *)(ptr[1] + uVar34 * 2 + 6)),3)
        ;
        auVar65 = vpinsrw_avx(auVar65,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(local_4b8 * iVar35) +
                                                       (long)*(short *)(ptr[1] + uVar34 * 2 + 8)),4)
        ;
        auVar65 = vpinsrw_avx(auVar65,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(local_4c8 * iVar35) +
                                                       (long)*(short *)(ptr[1] + uVar34 * 2 + 10)),5
                             );
        auVar65 = vpinsrw_avx(auVar65,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar33 * iVar35) +
                                                       (long)*(short *)(ptr[1] + uVar34 * 2 + 0xc)),
                              6);
        auVar65 = vpinsrw_avx(auVar65,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar20 * iVar35) +
                                                       (long)*(short *)(ptr[1] + uVar34 * 2 + 0xe)),
                              7);
        auVar66 = vpinsrw_avx(ZEXT416((uint)piVar4[(long)(int)(uVar38 * iVar35) +
                                                   (long)*(short *)(*ptr + uVar34 * 2)]),
                              (uint)*(ushort *)
                                     (piVar4 + (long)(int)(local_4e0 * iVar35) +
                                               (long)*(short *)(*ptr + uVar34 * 2 + 2)),1);
        auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar29 * iVar35) +
                                                       (long)*(short *)(*ptr + uVar34 * 2 + 4)),2);
        auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(local_4d8 * iVar35) +
                                                       (long)*(short *)(*ptr + uVar34 * 2 + 6)),3);
        auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar22 * iVar35) +
                                                       (long)*(short *)(*ptr + uVar34 * 2 + 8)),4);
        auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(local_4d0 * iVar35) +
                                                       (long)*(short *)(*ptr + uVar34 * 2 + 10)),5);
        auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar17 * iVar35) +
                                                       (long)*(short *)(*ptr + uVar34 * 2 + 0xc)),6)
        ;
        auVar66 = vpinsrw_avx(auVar66,(uint)*(ushort *)
                                             (piVar4 + (long)(int)(uVar16 * iVar35) +
                                                       (long)*(short *)(*ptr + uVar34 * 2 + 0xe)),7)
        ;
        iVar2 = ptr_00[uVar34 + 0xf];
        auVar61._2_2_ = iVar2;
        auVar61._0_2_ = iVar2;
        auVar61._4_2_ = iVar2;
        auVar61._6_2_ = iVar2;
        auVar61._8_2_ = iVar2;
        auVar61._10_2_ = iVar2;
        auVar61._12_2_ = iVar2;
        auVar61._14_2_ = iVar2;
        auVar61._16_2_ = iVar2;
        auVar61._18_2_ = iVar2;
        auVar61._20_2_ = iVar2;
        auVar61._22_2_ = iVar2;
        auVar61._24_2_ = iVar2;
        auVar61._26_2_ = iVar2;
        auVar61._28_2_ = iVar2;
        auVar61._30_2_ = iVar2;
        auVar49._0_16_ = ZEXT116(0) * auVar65 + ZEXT116(1) * auVar66;
        auVar49._16_16_ = ZEXT116(1) * auVar65;
        auVar51 = vpalignr_avx2(ZEXT1632(auVar45._16_16_),auVar45,2);
        auVar52 = vpblendw_avx2(auVar51,auVar61,0x80);
        auVar50 = vpaddsw_avx2(auVar47,auVar49);
        auVar47 = vpblendd_avx2(auVar51,auVar52,0xf0);
        iVar2 = ptr_01[uVar34 + 0xf];
        auVar60._2_2_ = iVar2;
        auVar60._0_2_ = iVar2;
        auVar60._4_2_ = iVar2;
        auVar60._6_2_ = iVar2;
        auVar60._8_2_ = iVar2;
        auVar60._10_2_ = iVar2;
        auVar60._12_2_ = iVar2;
        auVar60._14_2_ = iVar2;
        auVar60._16_2_ = iVar2;
        auVar60._18_2_ = iVar2;
        auVar60._20_2_ = iVar2;
        auVar60._22_2_ = iVar2;
        auVar60._24_2_ = iVar2;
        auVar60._26_2_ = iVar2;
        auVar60._28_2_ = iVar2;
        auVar60._30_2_ = iVar2;
        auVar51 = vpalignr_avx2(ZEXT1632(auVar6._16_16_),auVar6,2);
        auVar52 = vpblendw_avx2(auVar51,auVar60,0x80);
        auVar52 = vpblendd_avx2(auVar51,auVar52,0xf0);
        auVar14._2_2_ = uStack_de;
        auVar14._0_2_ = local_e0;
        auVar14._4_2_ = uStack_dc;
        auVar14._6_2_ = uStack_da;
        auVar14._8_2_ = uStack_d8;
        auVar14._10_2_ = uStack_d6;
        auVar14._12_2_ = uStack_d4;
        auVar14._14_2_ = uStack_d2;
        auVar14._16_2_ = uStack_d0;
        auVar14._18_2_ = uStack_ce;
        auVar14._20_2_ = uStack_cc;
        auVar14._22_2_ = uStack_ca;
        auVar14._24_2_ = uStack_c8;
        auVar14._26_2_ = uStack_c6;
        auVar14._28_2_ = uStack_c4;
        auVar14._30_2_ = uStack_c2;
        auVar51 = vpsubsw_avx2(auVar47,auVar14);
        auVar13._2_2_ = sStack_fe;
        auVar13._0_2_ = local_100;
        auVar13._4_2_ = sStack_fc;
        auVar13._6_2_ = sStack_fa;
        auVar13._8_2_ = sStack_f8;
        auVar13._10_2_ = sStack_f6;
        auVar13._12_2_ = sStack_f4;
        auVar13._14_2_ = sStack_f2;
        auVar13._16_2_ = sStack_f0;
        auVar13._18_2_ = sStack_ee;
        auVar13._20_2_ = sStack_ec;
        auVar13._22_2_ = sStack_ea;
        auVar13._24_2_ = sStack_e8;
        auVar13._26_2_ = sStack_e6;
        auVar13._28_2_ = sStack_e4;
        auVar13._30_2_ = sStack_e2;
        auVar52 = vpsubsw_avx2(auVar52,auVar13);
        auVar51 = vpmaxsw_avx2(auVar51,auVar52);
        auVar45 = vpsubsw_avx2(auVar45,auVar14);
        auVar46 = vpsubsw_avx2(auVar46,auVar13);
        auVar52 = vpmaxsw_avx2(auVar45,auVar46);
        auVar45 = vpmaxsw_avx2(auVar52,auVar51);
        auVar50 = vpmaxsw_avx2(auVar45,auVar50);
        auVar46 = vpcmpeqw_avx2(auVar42,_DAT_00909280);
        auVar45 = vpblendvb_avx2(auVar50,local_2e0,auVar46);
        if (0xf < uVar34) {
          local_2a0 = vpminsw_avx2(auVar45,local_2a0);
          local_280 = vpmaxsw_avx2(auVar45,local_280);
        }
        piVar5 = ((ppVar18->field_4).rowcols)->score_row;
        auVar65 = auVar45._0_16_;
        auVar66 = auVar45._16_16_;
        if (uVar34 < uVar23) {
          uVar31 = vpextrw_avx(auVar66,7);
          *(int *)((long)piVar5 + uVar34 * 4 + local_3f8) = (int)(short)uVar31;
        }
        if (uVar34 - 1 < uVar23 && (uVar39 | 1) < uVar36) {
          uVar31 = vpextrw_avx(auVar66,6);
          *(int *)((long)piVar5 + uVar34 * 4 + local_3f0) = (int)(short)uVar31;
        }
        if (((uVar39 | 2) < uVar36) && ((long)(uVar34 - 2) < (long)uVar23 && 1 < uVar34)) {
          uVar31 = vpextrw_avx(auVar66,5);
          *(int *)((long)piVar5 + uVar34 * 4 + local_460) = (int)(short)uVar31;
        }
        if (((uVar39 | 3) < uVar36) && ((long)(uVar34 - 3) < (long)uVar23 && 2 < uVar34)) {
          uVar31 = vpextrw_avx(auVar66,4);
          *(int *)((long)piVar5 + uVar34 * 4 + local_418) = (int)(short)uVar31;
        }
        if (((uVar39 | 4) < uVar36) && ((long)(uVar34 - 4) < (long)uVar23 && 3 < uVar34)) {
          uVar31 = vpextrw_avx(auVar66,3);
          *(int *)((long)piVar5 + uVar34 * 4 + local_458) = (int)(short)uVar31;
        }
        if (((uVar39 | 5) < uVar36) && ((long)(uVar34 - 5) < (long)uVar23 && 4 < uVar34)) {
          uVar31 = vpextrw_avx(auVar66,2);
          *(int *)((long)piVar5 + uVar34 * 4 + local_450) = (int)(short)uVar31;
        }
        if (((uVar39 | 6) < uVar36) && ((long)(uVar34 - 6) < (long)uVar23 && 5 < uVar34)) {
          uVar31 = vpextrw_avx(auVar66,1);
          *(int *)((long)piVar5 + uVar34 * 4 + local_410) = (int)(short)uVar31;
        }
        if (((uVar39 | 7) < uVar36) && ((long)(uVar34 - 7) < (long)uVar23 && 6 < uVar34)) {
          *(int *)((long)piVar5 + uVar34 * 4 + local_440) = (int)auVar45._16_2_;
        }
        if (((uVar39 | 8) < uVar36) && ((long)(uVar34 - 8) < (long)uVar23 && 7 < uVar34)) {
          uVar31 = vpextrw_avx(auVar65,7);
          *(int *)((long)piVar5 + uVar34 * 4 + local_438) = (int)(short)uVar31;
        }
        if (((uVar39 | 9) < uVar36) && ((long)(uVar34 - 9) < (long)uVar23 && 8 < uVar34)) {
          uVar31 = vpextrw_avx(auVar65,6);
          *(int *)((long)piVar5 + uVar34 * 4 + local_430) = (int)(short)uVar31;
        }
        if (((uVar39 | 10) < uVar36) && ((long)(uVar34 - 10) < (long)uVar23 && 9 < uVar34)) {
          uVar31 = vpextrw_avx(auVar65,5);
          *(int *)((long)piVar5 + uVar34 * 4 + local_448) = (int)(short)uVar31;
        }
        if (((uVar39 | 0xb) < uVar36) && ((long)(uVar34 - 0xb) < (long)uVar23 && 10 < uVar34)) {
          uVar31 = vpextrw_avx(auVar65,4);
          *(int *)((long)piVar5 + uVar34 * 4 + local_428) = (int)(short)uVar31;
        }
        if (((uVar39 | 0xc) < uVar36) && ((long)(uVar34 - 0xc) < (long)uVar23 && 0xb < uVar34)) {
          uVar31 = vpextrw_avx(auVar65,3);
          *(int *)((long)piVar5 + uVar34 * 4 + local_420) = (int)(short)uVar31;
        }
        if (((uVar39 | 0xd) < uVar36) && ((long)(uVar34 - 0xd) < (long)uVar23 && 0xc < uVar34)) {
          uVar31 = vpextrw_avx(auVar65,2);
          *(int *)((long)piVar5 + uVar34 * 4 + local_408) = (int)(short)uVar31;
        }
        if (((uVar39 | 0xe) < uVar36) && ((long)(uVar34 - 0xe) < (long)uVar23 && 0xd < uVar34)) {
          uVar31 = vpextrw_avx(auVar65,1);
          *(int *)((long)piVar5 + uVar34 * 4 + local_400) = (int)(short)uVar31;
        }
        auVar7._2_2_ = iVar41;
        auVar7._0_2_ = iVar41;
        auVar7._4_2_ = iVar41;
        auVar7._6_2_ = iVar41;
        auVar7._8_2_ = iVar41;
        auVar7._10_2_ = iVar41;
        auVar7._12_2_ = iVar41;
        auVar7._14_2_ = iVar41;
        auVar7._16_2_ = iVar41;
        auVar7._18_2_ = iVar41;
        auVar7._20_2_ = iVar41;
        auVar7._22_2_ = iVar41;
        auVar7._24_2_ = iVar41;
        auVar7._26_2_ = iVar41;
        auVar7._28_2_ = iVar41;
        auVar7._30_2_ = iVar41;
        auVar6 = vpblendvb_avx2(auVar51,auVar7,auVar46);
        if (0xe < uVar34 && (uVar39 | 0xf) < uVar36) {
          *(int *)((long)piVar5 + uVar34 * 4 + local_3e8) = (int)auVar45._0_2_;
        }
        auVar8._2_2_ = iVar41;
        auVar8._0_2_ = iVar41;
        auVar8._4_2_ = iVar41;
        auVar8._6_2_ = iVar41;
        auVar8._8_2_ = iVar41;
        auVar8._10_2_ = iVar41;
        auVar8._12_2_ = iVar41;
        auVar8._14_2_ = iVar41;
        auVar8._16_2_ = iVar41;
        auVar8._18_2_ = iVar41;
        auVar8._20_2_ = iVar41;
        auVar8._22_2_ = iVar41;
        auVar8._24_2_ = iVar41;
        auVar8._26_2_ = iVar41;
        auVar8._28_2_ = iVar41;
        auVar8._30_2_ = iVar41;
        auVar46 = vpblendvb_avx2(auVar52,auVar8,auVar46);
        auVar52 = vpcmpgtw_avx2(local_a0,local_300);
        auVar53 = vpcmpeqw_avx2(auVar42,local_120);
        auVar51 = vpcmpgtw_avx2(local_c0,auVar42);
        auVar59 = vpsraw_avx2(auVar42,0xf);
        auVar51 = vpandn_avx2(auVar59,auVar51);
        auVar59 = vpcmpgtw_avx2(auVar45,auVar58._0_32_);
        auVar51 = vpand_avx2(local_80,auVar51);
        auVar51 = vpand_avx2(auVar51,auVar59);
        auVar59 = vpcmpgtw_avx2(auVar45,auVar57._0_32_);
        auVar52 = vpand_avx2(auVar53,auVar52);
        auVar52 = vpand_avx2(auVar52,auVar59);
        local_220 = vpblendvb_avx2(auVar58._0_32_,auVar50,auVar51);
        auVar58 = ZEXT3264(local_220);
        auVar50 = vpand_avx2(auVar53,local_80);
        local_1c0 = vpblendvb_avx2(auVar64._0_32_,auVar45,auVar50);
        auVar64 = ZEXT3264(local_1c0);
        local_240 = vpblendvb_avx2(auVar57._0_32_,auVar45,auVar52);
        auVar57 = ZEXT3264(local_240);
        local_260 = vpblendvb_avx2(auVar63._0_32_,local_300,auVar52);
        auVar63 = ZEXT3264(local_260);
        local_1e0 = vpblendvb_avx2(auVar62._0_32_,auVar42,auVar51);
        auVar62 = ZEXT3264(local_1e0);
        ptr_00[uVar34] = auVar45._0_2_;
        vpextrw_avx(auVar6._0_16_,0);
        auVar12._8_2_ = 1;
        auVar12._0_8_ = 0x1000100010001;
        auVar12._10_2_ = 1;
        auVar12._12_2_ = 1;
        auVar12._14_2_ = 1;
        auVar12._16_2_ = 1;
        auVar12._18_2_ = 1;
        auVar12._20_2_ = 1;
        auVar12._22_2_ = 1;
        auVar12._24_2_ = 1;
        auVar12._26_2_ = 1;
        auVar12._28_2_ = 1;
        auVar12._30_2_ = 1;
        auVar42 = vpaddsw_avx2(auVar42,auVar12);
        uVar34 = uVar34 + 1;
      } while (uVar21 != uVar34);
      auVar11._8_2_ = 0x10;
      auVar11._0_8_ = 0x10001000100010;
      auVar11._10_2_ = 0x10;
      auVar11._12_2_ = 0x10;
      auVar11._14_2_ = 0x10;
      auVar11._16_2_ = 0x10;
      auVar11._18_2_ = 0x10;
      auVar11._20_2_ = 0x10;
      auVar11._22_2_ = 0x10;
      auVar11._24_2_ = 0x10;
      auVar11._26_2_ = 0x10;
      auVar11._28_2_ = 0x10;
      auVar11._30_2_ = 0x10;
      local_300 = vpaddsw_avx2(local_300,auVar11);
      local_2e0 = vpsubsw_avx2(local_2e0,local_200);
      local_3e8 = local_3e8 + lVar19;
      local_3f8 = local_3f8 + lVar19;
      local_3f0 = local_3f0 + lVar19;
      local_400 = local_400 + lVar19;
      local_408 = local_408 + lVar19;
      local_420 = local_420 + lVar19;
      local_428 = local_428 + lVar19;
      local_448 = local_448 + lVar19;
      local_430 = local_430 + lVar19;
      local_438 = local_438 + lVar19;
      local_440 = local_440 + lVar19;
      local_410 = local_410 + lVar19;
      local_450 = local_450 + lVar19;
      local_458 = local_458 + lVar19;
      local_418 = local_418 + lVar19;
      local_460 = local_460 + lVar19;
      uVar39 = uVar1;
    } while (uVar1 < uVar36);
  }
  lVar19 = 0;
  iVar28 = 0;
  iVar15 = 0;
  iVar35 = 0;
  uVar37 = uVar27;
  uVar20 = uVar27;
  do {
    uVar3 = *(ushort *)(local_240 + lVar19 * 2);
    if ((short)(ushort)uVar37 < (short)uVar3) {
      iVar26 = (int)*(short *)(local_260 + lVar19 * 2);
      iVar28 = (int)*(short *)(local_260 + lVar19 * 2);
      uVar37 = (uint)uVar3;
    }
    else {
      iVar26 = iVar35;
      if (uVar3 == (ushort)uVar37) {
        iVar32 = (int)*(short *)(local_260 + lVar19 * 2);
        iVar26 = iVar28;
        if (iVar32 <= iVar35) {
          iVar26 = iVar32;
        }
        iVar28 = iVar26;
        if (iVar32 < iVar35) {
          uVar37 = (uint)uVar3;
        }
      }
    }
    sVar56 = (short)uVar37;
    if ((short)uVar20 < (short)*(ushort *)(local_220 + lVar19 * 2)) {
      iVar15 = (int)*(short *)(local_1e0 + lVar19 * 2);
      uVar20 = (uint)*(ushort *)(local_220 + lVar19 * 2);
    }
    sVar25 = (short)uVar20;
    uVar38 = (uint)*(ushort *)(local_1c0 + lVar19 * 2);
    if ((short)*(ushort *)(local_1c0 + lVar19 * 2) <= (short)uVar27) {
      uVar38 = uVar27;
    }
    uVar27 = uVar38;
    lVar19 = lVar19 + 1;
    iVar35 = iVar26;
  } while ((int)lVar19 != 0x10);
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end == 0) {
      iVar26 = a - 1;
      sVar56 = (short)uVar27;
      iVar35 = s2Len + -1;
      if (s2_end != 0) {
        sVar56 = sVar25;
        iVar35 = iVar15;
      }
      goto LAB_007b7ebb;
    }
  }
  else if (sVar56 <= sVar25) {
    if ((sVar56 != sVar25) || (iVar35 = s2Len + -1, iVar15 != s2Len + -1)) {
      iVar26 = a - 1;
      sVar56 = sVar25;
      iVar35 = iVar15;
    }
    goto LAB_007b7ebb;
  }
  iVar35 = s2Len + -1;
LAB_007b7ebb:
  auVar9._2_2_ = iVar41;
  auVar9._0_2_ = iVar41;
  auVar9._4_2_ = iVar41;
  auVar9._6_2_ = iVar41;
  auVar9._8_2_ = iVar41;
  auVar9._10_2_ = iVar41;
  auVar9._12_2_ = iVar41;
  auVar9._14_2_ = iVar41;
  auVar9._16_2_ = iVar41;
  auVar9._18_2_ = iVar41;
  auVar9._20_2_ = iVar41;
  auVar9._22_2_ = iVar41;
  auVar9._24_2_ = iVar41;
  auVar9._26_2_ = iVar41;
  auVar9._28_2_ = iVar41;
  auVar9._30_2_ = iVar41;
  auVar55 = vpcmpgtw_avx2(auVar9,local_2a0);
  auVar10._2_2_ = sVar24;
  auVar10._0_2_ = sVar24;
  auVar10._4_2_ = sVar24;
  auVar10._6_2_ = sVar24;
  auVar10._8_2_ = sVar24;
  auVar10._10_2_ = sVar24;
  auVar10._12_2_ = sVar24;
  auVar10._14_2_ = sVar24;
  auVar10._16_2_ = sVar24;
  auVar10._18_2_ = sVar24;
  auVar10._20_2_ = sVar24;
  auVar10._22_2_ = sVar24;
  auVar10._24_2_ = sVar24;
  auVar10._26_2_ = sVar24;
  auVar10._28_2_ = sVar24;
  auVar10._30_2_ = sVar24;
  auVar42 = vpcmpgtw_avx2(local_280,auVar10);
  auVar55 = vpor_avx2(auVar55,auVar42);
  if ((((((((((((((((((((((((((((((((auVar55 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   || (auVar55 >> 0xf & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                  (auVar55 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar55 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar55 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar55 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar55 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar55 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar55 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar55 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar55 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar55 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar55 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar55 >> 0x7f,0) != '\0') ||
                    (auVar55 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar55 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar55 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar55 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar55 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar55 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar55 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar55 >> 0xbf,0) != '\0') ||
            (auVar55 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar55 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar55 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         (auVar55 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
        (auVar55 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
       (auVar55 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
      (auVar55 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || auVar55[0x1f] < '\0') {
    *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
    sVar56 = 0;
    iVar35 = 0;
    iVar26 = 0;
  }
  ppVar18->score = (int)sVar56;
  ppVar18->end_query = iVar26;
  ppVar18->end_ref = iVar35;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar18;
  }
  return ppVar18;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxHRow;
    __m256i vMaxHCol;
    __m256i vLastVal;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vGapN = s1_beg ? _mm256_set1_epi16(0) : _mm256_set1_epi16(gap*N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vILimit1 = _mm256_subs_epi16(vILimit, vOne);
    vJLimit = _mm256_set1_epi16(s2Len);
    vJLimit1 = _mm256_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm256_set1_epi16(0) : _mm256_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        __m256i vIeqLimit1 = _mm256_cmpeq_epi16(vI, vILimit1);
        vNH = _mm256_srli_si256_rpl(vNH, 2);
        vNH = _mm256_insert_epi16_rpl(vNH, H_pr[-1], 15);
        vWH = _mm256_srli_si256_rpl(vWH, 2);
        vWH = _mm256_insert_epi16_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 15);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m256i vJeqLimit1 = _mm256_cmpeq_epi16(vJ, vJLimit1);
                __m256i vJgtNegOne = _mm256_cmpgt_epi16(vJ, vNegOne);
                __m256i vJltLimit = _mm256_cmplt_epi16_rpl(vJ, vJLimit);
                __m256i cond_j = _mm256_and_si256(vIltLimit, vJeqLimit1);
                __m256i cond_i = _mm256_and_si256(vIeqLimit1,
                        _mm256_and_si256(vJgtNegOne, vJltLimit));
                __m256i cond_max_row = _mm256_cmpgt_epi16(vWH, vMaxHRow);
                __m256i cond_max_col = _mm256_cmpgt_epi16(vWH, vMaxHCol);
                __m256i cond_last_val = _mm256_and_si256(vIeqLimit1, vJeqLimit1);
                __m256i cond_all_row = _mm256_and_si256(cond_max_row, cond_i);
                __m256i cond_all_col = _mm256_and_si256(cond_max_col, cond_j);
                vMaxHRow = _mm256_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm256_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm256_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
        vIBoundary = _mm256_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}